

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O1

void writeModelSolution(FILE *file,HighsLogOptions *log_options,HighsModel *model,
                       HighsSolution *solution,HighsInfo *info,bool sparse)

{
  vector<double,_std::allocator<double>_> *primal_solution;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  bool bVar4;
  int iVar5;
  pointer pbVar6;
  long lVar7;
  HighsModel *pHVar8;
  FILE *pFVar9;
  HighsLogOptions *pHVar10;
  long lVar11;
  long lVar12;
  array<char,_32UL> valStr;
  string name;
  stringstream ss;
  string local_268;
  char local_241;
  HighsModel *local_240;
  string local_238;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  FILE *local_1f8;
  HighsLogOptions *local_1f0;
  HighsSolution *local_1e8;
  HighsInfo *local_1e0;
  pointer local_1d8;
  pointer local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c0 = (model->lp_).col_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (model->lp_).col_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1d0 = (model->lp_).row_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1d8 = (model->lp_).row_names_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  bVar4 = solution->value_valid;
  local_241 = solution->dual_valid;
  local_1e8 = solution;
  local_1e0 = info;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"\n# Primal solution values\n","");
  highsFprintfString(file,log_options,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  local_240 = model;
  local_1f8 = file;
  local_1f0 = log_options;
  if (bVar4 == false) {
LAB_0024ba11:
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"None\n","");
    highsFprintfString(file,log_options,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
  }
  else {
    iVar5 = (local_1e0->super_HighsInfoStruct).primal_solution_status;
    if (iVar5 == 2) {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Feasible\n","");
      highsFprintfString(file,log_options,&local_268);
    }
    else {
      if (iVar5 == 0) goto LAB_0024ba11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Infeasible\n","");
      highsFprintfString(file,log_options,&local_268);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    primal_solution = &local_1e8->col_value;
    writeModelObjective(file,log_options,model,primal_solution);
    writePrimalSolution(file,log_options,&model->lp_,primal_solution,sparse);
    if (sparse) goto LAB_0024c2a6;
    local_268._M_string_length = 0;
    local_268.field_2._M_local_buf[0] = '\0';
    psVar3 = (string *)(local_1a8 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str(psVar3);
    pHVar8 = local_240;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_268,"# Rows %d\n",(ulong)(uint)(pHVar8->lp_).num_row_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    pHVar10 = local_1f0;
    pFVar9 = local_1f8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(pFVar9,pHVar10,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if (0 < (pHVar8->lp_).num_row_) {
      paVar1 = &local_238.field_2;
      lVar11 = 8;
      lVar12 = 0;
      do {
        highsDoubleToString((array<char,_32UL> *)&local_268,
                            (local_1e8->row_value).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar12],1e-13);
        local_210 = 0;
        local_208[0] = 0;
        local_218 = local_208;
        std::__cxx11::stringbuf::str(psVar3);
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"R",1);
        std::ostream::operator<<(local_1a8,(int)lVar12);
        if (local_1d0 == local_1d8) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar6 = (local_240->lp_).row_names_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = *(long *)((long)pbVar6 + lVar11 + -8);
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,lVar7,
                     *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar11) + lVar7);
        }
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str(psVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        highsFormatToString_abi_cxx11_(&local_238,"%-s %s\n",local_218,&local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::stringbuf::str();
        highsFprintfString(local_1f8,local_1f0,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar12 < (local_240->lp_).num_row_);
    }
  }
  paVar1 = &local_268.field_2;
  local_268._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"\n# Dual solution values\n","");
  pHVar10 = local_1f0;
  pFVar9 = local_1f8;
  highsFprintfString(local_1f8,local_1f0,&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar1) {
    operator_delete(local_268._M_dataplus._M_p);
  }
  if (local_241 == '\0') {
LAB_0024baad:
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"None\n","");
    highsFprintfString(pFVar9,pHVar10,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
  }
  else {
    iVar5 = (local_1e0->super_HighsInfoStruct).dual_solution_status;
    if (iVar5 == 2) {
      local_268._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Feasible\n","");
      highsFprintfString(pFVar9,pHVar10,&local_268);
    }
    else {
      if (iVar5 == 0) goto LAB_0024baad;
      local_268._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"Infeasible\n","");
      highsFprintfString(pFVar9,pHVar10,&local_268);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    local_268._M_string_length = 0;
    local_268.field_2._M_local_buf[0] = '\0';
    psVar3 = (string *)(local_1a8 + 8);
    local_268._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str(psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_
              (&local_268,"# Columns %d\n",(ulong)(uint)(local_240->lp_).num_col_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(pFVar9,pHVar10,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar1) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    paVar1 = &local_238.field_2;
    if (0 < (local_240->lp_).num_col_) {
      lVar11 = 8;
      lVar12 = 0;
      do {
        highsDoubleToString((array<char,_32UL> *)&local_268,
                            (local_1e8->col_dual).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar12],1e-13);
        local_210 = 0;
        local_208[0] = 0;
        local_218 = local_208;
        std::__cxx11::stringbuf::str(psVar3);
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"C",1);
        std::ostream::operator<<(local_1a8,(int)lVar12);
        if (local_1c8 == local_1c0) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar6 = (local_240->lp_).col_names_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = *(long *)((long)pbVar6 + lVar11 + -8);
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,lVar7,
                     *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar11) + lVar7);
        }
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str(psVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        highsFormatToString_abi_cxx11_(&local_238,"%-s %s\n",local_218,&local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::stringbuf::str();
        highsFprintfString(local_1f8,local_1f0,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar12 < (local_240->lp_).num_col_);
    }
    paVar2 = &local_268.field_2;
    local_268._M_string_length = 0;
    local_268.field_2._M_local_buf[0] = '\0';
    local_268._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::stringbuf::str(psVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    highsFormatToString_abi_cxx11_(&local_268,"# Rows %d\n",(ulong)(uint)(local_240->lp_).num_row_);
    pFVar9 = local_1f8;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    std::__cxx11::stringbuf::str();
    highsFprintfString(pFVar9,local_1f0,&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != paVar2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    if (0 < (local_240->lp_).num_row_) {
      lVar11 = 8;
      lVar12 = 0;
      do {
        highsDoubleToString((array<char,_32UL> *)&local_268,
                            (local_1e8->row_dual).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar12],1e-13);
        local_210 = 0;
        local_208[0] = 0;
        local_218 = local_208;
        std::__cxx11::stringbuf::str(psVar3);
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"R",1);
        std::ostream::operator<<(local_1a8,(int)lVar12);
        if (local_1d0 == local_1d8) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar6 = (local_240->lp_).row_names_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar7 = *(long *)((long)pbVar6 + lVar11 + -8);
          local_218 = local_208;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,lVar7,
                     *(long *)((long)&(pbVar6->_M_dataplus)._M_p + lVar11) + lVar7);
        }
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str(psVar3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        highsFormatToString_abi_cxx11_(&local_238,"%-s %s\n",local_218,&local_268);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::stringbuf::str();
        highsFprintfString(local_1f8,local_1f0,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (local_218 != local_208) {
          operator_delete(local_218);
        }
        lVar12 = lVar12 + 1;
        lVar11 = lVar11 + 0x20;
      } while (lVar12 < (local_240->lp_).num_row_);
    }
  }
LAB_0024c2a6:
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writeModelSolution(FILE* file, const HighsLogOptions& log_options,
                        const HighsModel& model, const HighsSolution& solution,
                        const HighsInfo& info, const bool sparse) {
  const HighsLp& lp = model.lp_;
  const bool have_col_names = lp.col_names_.size() > 0;
  const bool have_row_names = lp.row_names_.size() > 0;
  const bool have_primal = solution.value_valid;
  const bool have_dual = solution.dual_valid;
  if (have_col_names) assert((int)lp.col_names_.size() >= lp.num_col_);
  if (have_row_names) assert((int)lp.row_names_.size() >= lp.num_row_);
  if (have_primal) {
    assert((int)solution.col_value.size() >= lp.num_col_);
    assert((int)solution.row_value.size() >= lp.num_row_);
    assert(info.primal_solution_status != kSolutionStatusNone);
  }
  if (have_dual) {
    assert((int)solution.col_dual.size() >= lp.num_col_);
    assert((int)solution.row_dual.size() >= lp.num_row_);
    assert(info.dual_solution_status != kSolutionStatusNone);
  }
  std::stringstream ss;
  highsFprintfString(file, log_options, "\n# Primal solution values\n");
  if (!have_primal || info.primal_solution_status == kSolutionStatusNone) {
    highsFprintfString(file, log_options, "None\n");
  } else {
    if (info.primal_solution_status == kSolutionStatusFeasible) {
      highsFprintfString(file, log_options, "Feasible\n");
    } else {
      assert(info.primal_solution_status == kSolutionStatusInfeasible);
      highsFprintfString(file, log_options, "Infeasible\n");
    }
    writeModelObjective(file, log_options, model, solution.col_value);
    writePrimalSolution(file, log_options, model.lp_, solution.col_value,
                        sparse);
    if (sparse) return;
    ss.str(std::string());
    ss << highsFormatToString("# Rows %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_row_; ix++) {
      auto valStr = highsDoubleToString(solution.row_value[ix],
                                        kHighsSolutionValueToStringTolerance);
      // Create a row name
      ss.str(std::string());
      ss << "R" << ix;
      const std::string name = have_row_names ? lp.row_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
  }
  highsFprintfString(file, log_options, "\n# Dual solution values\n");
  if (!have_dual || info.dual_solution_status == kSolutionStatusNone) {
    highsFprintfString(file, log_options, "None\n");
  } else {
    if (info.dual_solution_status == kSolutionStatusFeasible) {
      highsFprintfString(file, log_options, "Feasible\n");
    } else {
      assert(info.dual_solution_status == kSolutionStatusInfeasible);
      highsFprintfString(file, log_options, "Infeasible\n");
    }
    ss.str(std::string());
    ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n", lp.num_col_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
      auto valStr = highsDoubleToString(solution.col_dual[ix],
                                        kHighsSolutionValueToStringTolerance);
      ss.str(std::string());
      ss << "C" << ix;
      const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
    ss.str(std::string());
    ss << highsFormatToString("# Rows %" HIGHSINT_FORMAT "\n", lp.num_row_);
    highsFprintfString(file, log_options, ss.str());
    for (HighsInt ix = 0; ix < lp.num_row_; ix++) {
      auto valStr = highsDoubleToString(solution.row_dual[ix],
                                        kHighsSolutionValueToStringTolerance);
      ss.str(std::string());
      ss << "R" << ix;
      const std::string name = have_row_names ? lp.row_names_[ix] : ss.str();
      ss.str(std::string());
      ss << highsFormatToString("%-s %s\n", name.c_str(), valStr.data());
      highsFprintfString(file, log_options, ss.str());
    }
  }
}